

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.c
# Opt level: O1

void MOVEGEN_rook(int position,bitboard_t own,bitboard_t opponent,bitboard_t *moves,
                 bitboard_t *captures)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = own | opponent;
  uVar6 = bitboard_left[position] & uVar5 | 1;
  lVar3 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar6 = bitboard_right[position] & uVar5 | 0x8000000000000000;
  lVar1 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar6 = bitboard_up[position] & uVar5 | 0x8000000000000000;
  lVar2 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar6 = bitboard_down[position] & uVar5 | 1;
  lVar4 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar6 = bitboard_down[position] ^ *(ulong *)((long)bitboard_down + (ulong)(uint)((int)lVar4 << 3))
          | bitboard_up[position] ^ bitboard_up[lVar2] |
            bitboard_right[position] ^ bitboard_right[lVar1] |
            bitboard_left[position] ^
            *(ulong *)((long)bitboard_left + (ulong)(uint)((int)lVar3 << 3));
  *moves = ~uVar5 & uVar6;
  *captures = uVar6 & opponent;
  return;
}

Assistant:

void MOVEGEN_rook(const int position, const bitboard_t own, const bitboard_t opponent, bitboard_t *moves, bitboard_t *captures)
{
#ifdef __BMI2__
    bitboard_t occupied = own | opponent;
    bitboard_t all_moves = bitboard_rook_attacks[rook_attacks_offset[position] + _pext_u64(occupied, bitboard_rook_inner[position])];
    *moves = all_moves & ~occupied;
    *captures = all_moves & opponent;
#else
    bitboard_t occupied;
    bitboard_t left_moves, right_moves, up_moves, down_moves;
    bitboard_t rook_moves;
    bitboard_t blockers;
    int blocker_pos;
    
    occupied = own | opponent;
    
    /* LEFT */
    left_moves = bitboard_left[position];
    blockers = left_moves & occupied;
    blocker_pos = BITBOARD_find_bit_reversed(blockers | 1);
    left_moves ^= bitboard_left[blocker_pos];

    /* RIGHT */
    right_moves = bitboard_right[position];
    blockers = right_moves & occupied;
    blocker_pos = BITBOARD_find_bit(blockers | (bitboard_t)0x8000000000000000);
    right_moves ^= bitboard_right[blocker_pos];
    
    /* UP */
    up_moves = bitboard_up[position];
    blockers = up_moves & occupied;
    blocker_pos = BITBOARD_find_bit(blockers | (bitboard_t)0x8000000000000000);
    up_moves ^= bitboard_up[blocker_pos];
    
    /* DOWN */
    down_moves = bitboard_down[position];
    blockers = down_moves & occupied;
    blocker_pos = BITBOARD_find_bit_reversed(blockers | 1);
    down_moves ^= bitboard_down[blocker_pos];
    
    rook_moves = left_moves | right_moves | up_moves | down_moves;
    *moves = rook_moves & ~occupied;
    *captures = rook_moves & opponent;
#endif
}